

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execDbcc<(moira::Instr)51,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  short sVar2;
  uint addr;
  AEStackFrame frame;
  
  (*this->_vptr_Moira[0x19])(this,2);
  if ((this->reg).sr.z == true) {
    uVar1 = (this->reg).pc;
    addr = (int)(short)(this->queue).irc + uVar1;
    if ((addr & 1) != 0) {
      frame = makeFrame<0ul>(this,addr,addr + 2);
      execAddressError(this,frame,0);
      return;
    }
    sVar2 = (short)*(undefined4 *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
    *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = sVar2 + -1;
    if (sVar2 != 0) {
      (this->reg).pc = addr;
      goto LAB_001c9b49;
    }
    readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1 + 2);
  }
  else {
    (*this->_vptr_Moira[0x19])(this,2);
  }
  (this->reg).pc = (this->reg).pc + 2;
LAB_001c9b49:
  fullPrefetch<4ul,0>(this);
  return;
}

Assistant:

void
Moira::execDbcc(u16 opcode)
{
    sync(2);
    if (!cond<I>()) {

        int dn = _____________xxx(opcode);
        u32 newpc = reg.pc + (i16)queue.irc;

        bool takeBranch = readD<Word>(dn) != 0;
        
        // Check for address error
        if (misaligned<S>(newpc)) {
            execAddressError(makeFrame(newpc, newpc + 2));
            return;
        }
        
        // Decrement loop counter
        writeD<Word>(dn, readD<Word>(dn) - 1);

        // Branch
        if (takeBranch) {
            reg.pc = newpc;
            fullPrefetch<POLLIPL>();
            return;
        } else {
            (void)readM<MEM_PROG, Word>(reg.pc + 2);
        }
    } else {
        sync(2);
    }

    // Fall through to next instruction
    reg.pc += 2;
    fullPrefetch<POLLIPL>();
}